

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_exception_handler_test.cpp
# Opt level: O2

void __thiscall
GenericExceptionCatcher_Tests::generic_catcher_simple_tests::test_method
          (generic_catcher_simple_tests *this)

{
  GenericExceptionHandler<std::exception,_mittens::UnHandler<int>,_mittens::DefaultNoAction<std::exception>_>
  stdExceptionCatcher;
  GenericExceptionHandler<void,_mittens::UnHandler<int>,_mittens::DefaultNoAction<void>_> allCatcher
  ;
  
  throw_int(0);
  throw_std_exception();
  throw_int(0);
  throw_int(0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(generic_catcher_simple_tests)
{
   auto allCatcher = generic_handler<void>(EXIT_FAILURE, UnHandler<>());
   {
      try
      {
         throw_int();
      }
      catch (...)
      {
         BOOST_CHECK_EQUAL(EXIT_FAILURE, allCatcher.handleException());
      }
   }

   auto stdExceptionCatcher = generic_handler<std::exception>(EXIT_FAILURE, UnHandler<>()); //
   {
      try
      {
         throw_std_exception();
      }
      catch (...)
      {
         BOOST_CHECK_EQUAL(EXIT_FAILURE, stdExceptionCatcher.handleException());
      }
   }

   {
      try
      {
         throw_int();
      }
      catch (...)
      {
         BOOST_CHECK_THROW(stdExceptionCatcher.handleException(), int);
         BOOST_CHECK_EQUAL(EXIT_FAILURE, allCatcher.handleException());
      }
   }

   {
      // composition test
      auto catcher = generic_handler<void>(-1, stdExceptionCatcher);

      try
      {
         throw_int();
      }
      catch (...)
      {
         BOOST_CHECK_EQUAL(-1, catcher.handleException());
      }
   }
}